

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O3

void __thiscall tli_window_manager::TableBox::layout(TableBox *this)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  int iVar4;
  pointer pvVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  vector<int,_std::allocator<int>_> col_sizes;
  vector<int,_std::allocator<int>_> row_sizes;
  allocator_type local_65;
  value_type_conflict1 local_64;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->rows_,(value_type_conflict1 *)&local_60,
             (allocator_type *)&local_64);
  local_64 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,(long)this->cols_,&local_64,&local_65);
  uVar7 = this->rows_;
  if ((int)uVar7 < 1) {
    pvVar6 = (void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
  }
  else {
    iVar4 = this->cols_;
    lVar12 = 0;
    do {
      if (0 < iVar4) {
        pvVar5 = (this->table_).
                 super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = 0;
        lVar11 = 0;
        do {
          puVar2 = *(undefined8 **)
                    (*(long *)&pvVar5[lVar12].
                               super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                               ._M_impl.super__Vector_impl_data + lVar10);
          if (puVar2 != (undefined8 *)0x0) {
            (**(code **)*puVar2)();
            pvVar5 = (this->table_).
                     super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar3 = *(long *)(*(long *)&pvVar5[lVar12].
                                        super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar10);
            iVar4 = *(int *)(lVar3 + 0xc);
            if (iVar4 < local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar12]) {
              iVar4 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12];
            }
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar12] = iVar4;
            iVar4 = *(int *)(lVar3 + 8);
            iVar9 = *(int *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start._4_4_,
                                      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start._0_4_) + lVar11 * 4);
            if (iVar4 < iVar9) {
              iVar4 = iVar9;
            }
            *(int *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + lVar11 * 4) = iVar4;
            iVar4 = this->cols_;
          }
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0x10;
        } while (lVar11 < iVar4);
        uVar7 = this->rows_;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar7);
    pvVar6 = (void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (0 < (int)uVar7) {
      uVar1 = this->cols_;
      pvVar5 = (this->table_).
               super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = 0;
      iVar4 = 0;
      do {
        iVar9 = 0;
        if (0 < (int)uVar1) {
          lVar12 = *(long *)&pvVar5[uVar8].
                             super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          lVar10 = 0;
          iVar9 = 0;
          do {
            if (*(long *)(lVar12 + lVar10 * 4) != 0) {
              *(int *)(lVar12 + 8 + lVar10 * 4) = iVar4;
              *(int *)(lVar12 + 0xc + lVar10 * 4) = iVar9;
            }
            iVar9 = iVar9 + *(int *)((long)pvVar6 + lVar10);
            lVar10 = lVar10 + 4;
          } while ((ulong)uVar1 << 2 != lVar10);
        }
        iVar4 = iVar4 + local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar7);
      goto LAB_00103f76;
    }
  }
  iVar4 = 0;
  iVar9 = 0;
LAB_00103f76:
  (this->super_Box).width_ = iVar9;
  (this->super_Box).height_ = iVar4;
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TableBox::layout() {
    std::vector<int> row_sizes(rows_, 0);
    std::vector<int> col_sizes(cols_, 0);
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            if (table_[i][j].first) {
                table_[i][j].first->layout();
                row_sizes[i] = std::max(row_sizes[i], table_[i][j].first->height());
                col_sizes[j] = std::max(col_sizes[j], table_[i][j].first->width());
            }
        }
    }

    int current_col = 0;
    int current_row = 0;
    for (int i = 0; i < rows_; ++i) {
        current_col = 0;
        for (int j = 0; j < cols_; ++j) {
            if (table_[i][j].first) {
                table_[i][j].second = std::make_pair(current_row, current_col);
            }
            current_col += col_sizes[j];
        }
        current_row += row_sizes[i];
    }

//    for (int i = 0; i < rows_; ++i) {
//        for (int j = 0; j < cols_; ++j) {
//            std::cout << '(' << table_[i][j].second.first << ", " << table_[i][j].second.second << ") ";
//        }
//        std::cout << '\n';
//    }
//    std::cout << '\n';

    width_ = current_col;
    height_ = current_row;
}